

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

int __thiscall minja::Value::get<int>(Value *this)

{
  bool bVar1;
  int iVar2;
  runtime_error *this_00;
  Value *in_RDI;
  bool in_stack_00000143;
  int in_stack_00000144;
  Value *in_stack_00000148;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffac;
  string local_28 [40];
  
  bVar1 = is_primitive(in_RDI);
  if (!bVar1) {
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffa8);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    dump_abi_cxx11_(in_stack_00000148,in_stack_00000144,in_stack_00000143);
    std::operator+((char *)CONCAT44(in_stack_ffffffffffffffac,uVar3),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::runtime_error::runtime_error(this_00,local_28);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<int,int>((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_RDI);
  return iVar2;
}

Assistant:

T get() const {
    if (is_primitive()) return primitive_.get<T>();
    throw std::runtime_error("get<T> not defined for this value type: " + dump());
  }